

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsDropShadowEffect::setColor(QGraphicsDropShadowEffect *this,QColor *color)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  QColor QVar3;
  QColor local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  QVar3 = QPixmapDropShadowFilter::color(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  local_30._0_8_ = QVar3._0_8_;
  local_30.ct._4_4_ = QVar3.ct._4_4_;
  local_30.ct.argb.pad = QVar3.ct._8_2_;
  cVar2 = QColor::operator==(&local_30,(QColor *)color);
  if (cVar2 == '\0') {
    QPixmapDropShadowFilter::setColor(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8),color);
    QGraphicsEffect::update(&this->super_QGraphicsEffect);
    colorChanged(this,color);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::setColor(const QColor &color)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->color() == color)
        return;

    d->filter->setColor(color);
    update();
    emit colorChanged(color);
}